

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall
ON_SubDimple::LocalSubdivide(ON_SubDimple *this,ON_SubDFace **face_list,size_t face_list_count)

{
  ON_ComponentStatus *pOVar1;
  byte bVar2;
  ON_ComponentStatus OVar3;
  ON_SubDLevel *this_00;
  long lVar4;
  float afVar5 [2];
  ON_SubDEdgeSharpness OVar6;
  double sharpness1;
  ON_3dPoint vertex_location;
  undefined1 auVar7 [16];
  bool bVar8;
  uint uVar9;
  uint uVar10;
  double *pdVar11;
  ON_SubDEdge *this_01;
  ON_SubDVertex *pOVar12;
  float afVar13 [2];
  ON_SubDFace *pOVar14;
  size_t i;
  size_t sVar15;
  ulong uVar16;
  ON_SubDVertex *v1;
  ushort uVar17;
  ulong uVar18;
  uint evi;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ON_SubDEdgePtr *pOVar22;
  unsigned_short fei;
  ulong c;
  uint fei_1;
  ulong uVar23;
  ON_SubDEdge *pOVar24;
  ON_SubDFace **ppOVar25;
  ON_SubDEdge **ppOVar26;
  ON_SubDVertex **ppOVar27;
  uint local_13c;
  undefined1 local_128 [4];
  undefined1 auStack_124 [12];
  ON_3dPoint P;
  ON_SubDEdgeSharpness e_sharpness;
  double dStack_f0;
  double local_e8;
  ON_SimpleArray<ON_SubDEdge_*> radial_edges;
  ON_SimpleArray<ON_SubDEdgePtr> fbdry;
  ON_SimpleArray<ON_3dPoint> edge_points;
  ON_SimpleArray<ON_3dPoint> face_points;
  ON_SimpleArray<ON_SubDEdge_*> edges;
  ON_SimpleArray<ON_SubDFace_*> faces;
  
  if ((face_list_count != 0 && face_list != (ON_SubDFace **)0x0) &&
     (uVar19 = (this->m_levels).m_count, uVar19 != 0)) {
    for (sVar15 = 0; face_list_count != sVar15; sVar15 = sVar15 + 1) {
      pOVar14 = face_list[sVar15];
      if ((pOVar14 != (ON_SubDFace *)0x0) && (2 < pOVar14->m_edge_count)) {
        bVar2 = (pOVar14->super_ON_SubDComponentBase).m_level;
        if (bVar2 < uVar19) {
          if (((this->m_levels).m_a[bVar2] != (ON_SubDLevel *)0x0) &&
             (ClearHigherSubdivisionLevels(this,bVar2 + 1), bVar2 + 1 == (this->m_levels).m_count))
          {
            this_00 = (this->m_levels).m_a[bVar2];
            this->m_active_level = this_00;
            if ((this_00 != (ON_SubDLevel *)0x0) && (this_00->m_face_count != 0)) {
              ON_SubDLevel::ClearRuntimeMarks(this_00,true,true,true);
              auVar7._12_4_ = 0;
              auVar7._0_12_ = auStack_124;
              _local_128 = auVar7 << 0x20;
              uVar19 = 0;
              local_13c = 0;
              sVar15 = 0;
              goto LAB_005e1451;
            }
          }
          break;
        }
      }
    }
LAB_005e160e:
    ON_SubDIncrementErrorCount();
  }
  return false;
LAB_005e1451:
  if (sVar15 == face_list_count) goto LAB_005e1629;
  pOVar14 = face_list[sVar15];
  if (((pOVar14 != (ON_SubDFace *)0x0) && (2 < pOVar14->m_edge_count)) &&
     (bVar2 == (pOVar14->super_ON_SubDComponentBase).m_level)) {
    pOVar1 = &(pOVar14->super_ON_SubDComponentBase).m_status;
    bVar8 = ON_ComponentStatus::RuntimeMark(pOVar1);
    if (!bVar8) {
      ON_ComponentStatus::SetRuntimeMark(pOVar1);
      pdVar11 = ON_3dPoint::operator_cast_to_double_(&P);
      bVar8 = ON_SubDFace::GetSubdivisionPoint(pOVar14,pdVar11);
      if (!bVar8) goto LAB_005e160e;
      pOVar22 = pOVar14->m_edge4;
      for (uVar17 = 0; uVar17 < pOVar14->m_edge_count; uVar17 = uVar17 + 1) {
        if ((((uVar17 == 4) && (pOVar22 = pOVar14->m_edgex, pOVar22 == (ON_SubDEdgePtr *)0x0)) ||
            (pOVar24 = (ON_SubDEdge *)(pOVar22->m_ptr & 0xfffffffffffffff8),
            pOVar24 == (ON_SubDEdge *)0x0)) ||
           ((pOVar24->m_vertex[0] == (ON_SubDVertex *)0x0 ||
            (pOVar24->m_vertex[1] == (ON_SubDVertex *)0x0)))) goto LAB_005e160e;
        pOVar1 = &(pOVar24->super_ON_SubDComponentBase).m_status;
        bVar8 = ON_ComponentStatus::RuntimeMark(pOVar1);
        if (!bVar8) {
          ON_SubDEdge::UpdateEdgeSectorCoefficientsForExperts(pOVar24,true);
          ON_ComponentStatus::SetRuntimeMark(pOVar1);
          pdVar11 = ON_3dPoint::operator_cast_to_double_(&P);
          bVar8 = ON_SubDEdge::GetSubdivisionPoint(pOVar24,pdVar11);
          if (!bVar8) goto LAB_005e160e;
          for (lVar20 = 0; lVar20 != 2; lVar20 = lVar20 + 1) {
            bVar8 = ON_ComponentStatus::RuntimeMark
                              (&(pOVar24->m_vertex[lVar20]->super_ON_SubDComponentBase).m_status);
            if (!bVar8) {
              ON_ComponentStatus::SetRuntimeMark
                        (&(pOVar24->m_vertex[lVar20]->super_ON_SubDComponentBase).m_status);
              pOVar12 = pOVar24->m_vertex[lVar20];
              pdVar11 = ON_3dPoint::operator_cast_to_double_(&P);
              bVar8 = ON_SubDVertex::GetSubdivisionPoint(pOVar12,pdVar11);
              if (!bVar8) goto LAB_005e160e;
              local_128 = (undefined1  [4])((int)local_128 + 1);
            }
          }
          uVar19 = uVar19 + 1;
        }
        pOVar22 = pOVar22 + 1;
      }
      local_13c = local_13c + 1;
    }
  }
  sVar15 = sVar15 + 1;
  goto LAB_005e1451;
LAB_005e1629:
  bVar8 = false;
  if (((local_13c != 0) && (bVar8 = false, 2 < uVar19)) && (2 < (uint)local_128)) {
    if (local_13c < this_00->m_face_count) {
      c = (ulong)local_13c;
      ON_SimpleArray<ON_SubDFace_*>::ON_SimpleArray(&faces,c);
      ON_SimpleArray<ON_3dPoint>::ON_SimpleArray(&face_points,c);
      ChangeGeometryContentSerialNumber(this,false);
      ppOVar25 = this_00->m_face;
      while (afVar13 = (float  [2])*ppOVar25, afVar13 != (float  [2])0x0) {
        bVar8 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)((long)afVar13 + 0x10));
        if (bVar8) {
          e_sharpness.m_edge_sharpness = afVar13;
          ON_SimpleArray<ON_SubDFace_*>::Append(&faces,(ON_SubDFace **)&e_sharpness);
          ON_SubDFace::SubdivisionPoint((ON_3dPoint *)&e_sharpness,(ON_SubDFace *)afVar13);
          P.z = local_e8;
          P.x = (double)e_sharpness.m_edge_sharpness;
          P.y = dStack_f0;
          bVar8 = ON_3dPoint::IsValid(&P);
          if (!bVar8) {
            ON_SubDIncrementErrorCount();
            goto LAB_005e18c2;
          }
          ON_SimpleArray<ON_3dPoint>::Append(&face_points,&P);
        }
        ppOVar25 = (ON_SubDFace **)((long)afVar13 + 0x58);
      }
      if (local_13c == face_points.m_count) {
        uVar18 = (ulong)uVar19;
        ON_SimpleArray<ON_3dPoint>::ON_SimpleArray(&edge_points,uVar18);
        ON_SimpleArray<ON_SubDEdge_*>::ON_SimpleArray(&edges,uVar18);
        ppOVar26 = this_00->m_edge;
        while (afVar13 = (float  [2])*ppOVar26, afVar13 != (float  [2])0x0) {
          bVar8 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)((long)afVar13 + 0x10));
          if (bVar8) {
            if (((*(ON_SubDEdgeTag *)((long)afVar13 + 0x60) == SmoothX) ||
                (*(ON_SubDEdgeTag *)((long)afVar13 + 0x60) == Smooth)) &&
               ((*(unsigned_short *)((long)afVar13 + 100) == 2 &&
                (uVar9 = ON_SubDEdge::MarkedFaceCount((ON_SubDEdge *)afVar13), uVar9 == 2)))) {
              ON_SubDEdge::SubdivisionPoint((ON_3dPoint *)&e_sharpness,(ON_SubDEdge *)afVar13);
            }
            else {
              ON_SubDEdge::ControlNetCenterPoint((ON_3dPoint *)&e_sharpness,(ON_SubDEdge *)afVar13);
            }
            P.z = local_e8;
            P.x = (double)e_sharpness.m_edge_sharpness;
            P.y = dStack_f0;
            ON_SimpleArray<ON_3dPoint>::Append(&edge_points,&P);
            e_sharpness.m_edge_sharpness = afVar13;
            ON_SimpleArray<ON_SubDEdge_*>::Append(&edges,(ON_SubDEdge **)&e_sharpness);
          }
          ppOVar26 = (ON_SubDEdge **)((long)afVar13 + 0x58);
        }
        if (uVar19 == edge_points.m_count) {
          ppOVar27 = this_00->m_vertex;
          while (pOVar12 = *ppOVar27, pOVar12 != (ON_SubDVertex *)0x0) {
            bVar8 = ON_ComponentStatus::RuntimeMark(&(pOVar12->super_ON_SubDComponentBase).m_status)
            ;
            if (((bVar8) && (uVar17 = pOVar12->m_edge_count, 1 < uVar17)) &&
               (uVar19 = ON_SubDVertex::MarkedEdgeCount(pOVar12), uVar19 == uVar17)) {
              ON_SubDVertex::SubdivisionPoint((ON_3dPoint *)&e_sharpness,pOVar12);
              P.z = local_e8;
              P.x = (double)e_sharpness.m_edge_sharpness;
              P.y = dStack_f0;
              pOVar12->m_P[0] = (double)e_sharpness.m_edge_sharpness;
              pOVar12->m_P[1] = dStack_f0;
              pOVar12->m_P[2] = local_e8;
            }
            ppOVar27 = &pOVar12->m_next_vertex;
          }
          lVar20 = 0;
          for (uVar21 = 0; uVar18 != uVar21; uVar21 = uVar21 + 1) {
            pOVar24 = edges.m_a[uVar21];
            OVar6 = ON_SubDEdge::Sharpness(pOVar24,false);
            e_sharpness.m_edge_sharpness = OVar6.m_edge_sharpness;
            ON_SubDEdge::EdgeModifiedNofification(pOVar24);
            vertex_location.z = *(double *)((long)&(edge_points.m_a)->z + lVar20);
            vertex_location._0_16_ = *(undefined1 (*) [16])((long)&(edge_points.m_a)->x + lVar20);
            this_01 = SplitEdge(this,pOVar24,vertex_location);
            if (this_01 == (ON_SubDEdge *)0x0) {
              ON_SubDIncrementErrorCount();
              goto LAB_005e1d2a;
            }
            ON_ComponentStatus::ClearRuntimeMark(&(this_01->super_ON_SubDComponentBase).m_status);
            ON_ComponentStatus::SetRuntimeMark(&(pOVar24->super_ON_SubDComponentBase).m_status);
            local_128 = OVar6.m_edge_sharpness[0];
            auStack_124._0_4_ = OVar6.m_edge_sharpness[1];
            sharpness1 = ON_SubDEdgeSharpness::Average(&e_sharpness);
            OVar6 = ON_SubDEdgeSharpness::FromInterval((double)(float)local_128,sharpness1);
            ON_SubDEdge::SetSharpnessForExperts(pOVar24,OVar6);
            OVar6 = ON_SubDEdgeSharpness::FromInterval(sharpness1,(double)(float)auStack_124._0_4_);
            ON_SubDEdge::SetSharpnessForExperts(this_01,OVar6);
            lVar20 = lVar20 + 0x18;
          }
          ON_SimpleArray<ON_SubDEdgePtr>::ON_SimpleArray(&fbdry,0x20);
          ON_SimpleArray<ON_SubDEdge_*>::ON_SimpleArray(&radial_edges,0x20);
          for (uVar18 = 0; uVar18 != c; uVar18 = uVar18 + 1) {
            pOVar14 = faces.m_a[uVar18];
            ON_SubDFace::FaceModifiedNofification(pOVar14);
            P.x = face_points.m_a[uVar18].x;
            P.y = face_points.m_a[uVar18].y;
            P.z = face_points.m_a[uVar18].z;
            if (-1 < fbdry.m_capacity) {
              fbdry.m_count = 0;
            }
            uVar19 = ON_SubDFace::GetEdgeArray(pOVar14,&fbdry);
            pOVar22 = fbdry.m_a;
            if ((uVar19 < 6) || ((uVar19 & 1) != 0)) {
              bVar8 = c <= uVar18;
              ON_SubDIncrementErrorCount();
              goto LAB_005e1e1a;
            }
            uVar21 = (fbdry.m_a)->m_ptr & 0xfffffffffffffff8;
            if (((uVar21 != 0) &&
                (lVar20 = *(long *)(uVar21 + 0x80 + (ulong)((uint)(fbdry.m_a)->m_ptr & 1) * 8),
                lVar20 != 0)) &&
               (bVar8 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(lVar20 + 0x10)),
               !bVar8)) {
              ON_SimpleArray<ON_SubDEdgePtr>::Append(&fbdry,pOVar22);
              pOVar22 = fbdry.m_a + 1;
            }
            uVar9 = (pOVar14->super_ON_SubDComponentBase).m_id;
            OVar3 = (pOVar14->super_ON_SubDComponentBase).m_status;
            uVar21 = (ulong)uVar19;
            for (uVar23 = 0; uVar21 != uVar23; uVar23 = uVar23 + 1) {
              uVar16 = pOVar22[uVar23].m_ptr & 0xfffffffffffffff8;
              if (uVar16 == 0) {
                bVar8 = c <= uVar18;
                ON_SubDIncrementErrorCount();
                goto LAB_005e1e1a;
              }
              uVar10 = (uint)pOVar22[uVar23].m_ptr & 1;
              lVar20 = *(long *)(uVar16 + 0x80 + (ulong)uVar10 * 8);
              lVar4 = *(long *)(uVar16 + 0x80 + (ulong)(uVar10 ^ 1) * 8);
              if (((lVar20 == lVar4) || (lVar20 == 0)) || (lVar4 == 0)) {
                bVar8 = c <= uVar18;
                ON_SubDIncrementErrorCount();
                goto LAB_005e1e1a;
              }
              if ((uVar23 & 1) == 0) {
                bVar8 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(lVar20 + 0x10));
                if (!bVar8) {
                  bVar8 = c <= uVar18;
                  ON_SubDIncrementErrorCount();
                  goto LAB_005e1e1a;
                }
                bVar8 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(lVar4 + 0x10));
                if (bVar8) {
                  bVar8 = c <= uVar18;
                  ON_SubDIncrementErrorCount();
                  goto LAB_005e1e1a;
                }
              }
              else {
                bVar8 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(lVar20 + 0x10));
                if (bVar8) {
                  bVar8 = c <= uVar18;
                  ON_SubDIncrementErrorCount();
                  goto LAB_005e1e1a;
                }
                bVar8 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(lVar4 + 0x10));
                if (!bVar8) {
                  bVar8 = c <= uVar18;
                  ON_SubDIncrementErrorCount();
                  goto LAB_005e1e1a;
                }
              }
            }
            for (uVar23 = 0; uVar23 < pOVar14->m_edge_count; uVar23 = uVar23 + 1) {
              ON_SubDEdge::RemoveFaceFromArray
                        ((ON_SubDEdge *)(pOVar22[uVar23].m_ptr & 0xfffffffffffffff8),pOVar14);
              ON_SubDVertex::RemoveFaceFromArray
                        (*(ON_SubDVertex **)
                          ((pOVar22[uVar23].m_ptr & 0xfffffffffffffff8) + 0x80 +
                          (ulong)((uint)pOVar22[uVar23].m_ptr & 1) * 8),pOVar14);
            }
            ReturnFace(this,pOVar14);
            pOVar12 = AllocateVertex(this,Smooth,(uint)bVar2,&P.x);
            AddVertexToLevel(this,pOVar12);
            if (-1 < radial_edges.m_capacity) {
              radial_edges.m_count = 0;
            }
            ON_SimpleArray<ON_SubDEdge_*>::Reserve(&radial_edges,(ulong)(uVar19 >> 1));
            for (uVar23 = 0; uVar23 < uVar21; uVar23 = uVar23 + 2) {
              uVar16 = pOVar22[uVar23].m_ptr & 0xfffffffffffffff8;
              if (uVar16 == 0) {
                v1 = (ON_SubDVertex *)0x0;
              }
              else {
                v1 = *(ON_SubDVertex **)
                      (uVar16 + 0x80 + (ulong)(~(uint)pOVar22[uVar23].m_ptr & 1) * 8);
              }
              e_sharpness.m_edge_sharpness =
                   (float  [2])AddEdge(this,Smooth,pOVar12,-8883.0,v1,-8883.0);
              ON_SimpleArray<ON_SubDEdge_*>::Append(&radial_edges,(ON_SubDEdge **)&e_sharpness);
            }
            afVar13 = *(float (*) [2])(radial_edges.m_a + ((uVar19 >> 1) - 1));
            for (uVar23 = 0; uVar23 < uVar21; uVar23 = uVar23 + 2) {
              afVar5 = *(float (*) [2])((long)radial_edges.m_a + uVar23 * 4);
              e_sharpness.m_edge_sharpness = afVar13;
              pOVar14 = AddFace(this,uVar9,4,(ON_SubDEdgePtr *)&e_sharpness);
              (pOVar14->super_ON_SubDComponentBase).m_status = OVar3;
              uVar9 = 0;
              afVar13 = afVar5;
            }
          }
          ON_SubDLevel::ClearRuntimeMarks(this_00,true,true,false);
          (this_00->m_aggregates).m_bDirtyBoundingBox = true;
          ON_SubDLevel::ClearEvaluationCache(this_00);
          (this_00->m_aggregates).m_bDirtyEdgeAttributes = true;
          bVar8 = true;
          if (this->m_active_level != (ON_SubDLevel *)0x0) {
            ON_SubDLevel::UpdateAllTagsAndSectorCoefficients(this->m_active_level,true);
          }
LAB_005e1e1a:
          ON_SimpleArray<ON_SubDEdge_*>::~ON_SimpleArray(&radial_edges);
          ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray(&fbdry);
        }
        else {
          ON_SubDIncrementErrorCount();
LAB_005e1d2a:
          bVar8 = false;
        }
        ON_SimpleArray<ON_SubDEdge_*>::~ON_SimpleArray(&edges);
        ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&edge_points);
      }
      else {
        ON_SubDIncrementErrorCount();
LAB_005e18c2:
        bVar8 = false;
      }
      ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&face_points);
      ON_SimpleArray<ON_SubDFace_*>::~ON_SimpleArray(&faces);
    }
    else {
      uVar19 = GlobalSubdivide(this);
      bVar8 = uVar19 != 0;
    }
  }
  return bVar8;
}

Assistant:

bool ON_SubDimple::LocalSubdivide(
  ON_SubDFace const*const* face_list,
  size_t face_list_count
)
{
  if (nullptr == face_list || face_list_count < 1 || m_levels.UnsignedCount() < 1)
    return false;

  unsigned int level0_index = ON_UNSET_UINT_INDEX;
  for (size_t i = 0; i < face_list_count; ++i)
  {
    const ON_SubDFace* f = face_list[i];
    if (nullptr == f || f->m_edge_count < 3 || f->SubdivisionLevel() >= m_levels.UnsignedCount())
      continue;
    level0_index = f->SubdivisionLevel();
    break;
  }
  
  if (level0_index >= m_levels.UnsignedCount() || nullptr == m_levels[level0_index])
    return ON_SUBD_RETURN_ERROR(false);

  ClearHigherSubdivisionLevels(level0_index + 1);
  if (level0_index + 1 != m_levels.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(false);

  m_active_level = m_levels[level0_index];
  if ( nullptr == m_active_level || 0 == m_active_level->m_face_count)
    return ON_SUBD_RETURN_ERROR(false);

  ON_SubDLevel& level0 = *m_levels[level0_index];
  m_active_level = &level0;

  level0.ClearRuntimeMarks(true, true, true);

  unsigned face_count = 0;
  unsigned edge_count = 0;
  unsigned vertex_count = 0;
  ON_3dPoint P;
  for (size_t i = 0; i < face_list_count; ++i)
  {
    const ON_SubDFace* f = face_list[i];
    if (nullptr == f || f->m_edge_count < 3 || level0_index != f->SubdivisionLevel() )
      continue;
    if (f->m_status.RuntimeMark())
      continue;
    f->m_status.SetRuntimeMark();
    if ( false == f->GetSubdivisionPoint(P))
      return ON_SUBD_RETURN_ERROR(false);
    const ON_SubDEdgePtr* eptr = f->m_edge4;
    for (unsigned short fei = 0; fei < f->m_edge_count; ++fei, ++eptr)
    {
      if (4 == fei)
      {
        eptr = f->m_edgex;
        if (nullptr == eptr)
          return ON_SUBD_RETURN_ERROR(false);
      }
      ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
      if (nullptr == e || nullptr == e->m_vertex[0] || nullptr == e->m_vertex[1])
        return ON_SUBD_RETURN_ERROR(false);
      if (e->m_status.RuntimeMark())
        continue;
      e->UpdateEdgeSectorCoefficientsForExperts(true);
      e->m_status.SetRuntimeMark();
      if (false == e->GetSubdivisionPoint(P))
        return ON_SUBD_RETURN_ERROR(false);
      for (unsigned evi = 0; evi < 2; ++evi)
      {
        if (e->m_vertex[evi]->m_status.RuntimeMark())
          continue;
        e->m_vertex[evi]->m_status.SetRuntimeMark();
        if ( false == e->m_vertex[evi]->GetSubdivisionPoint(P) )
          return ON_SUBD_RETURN_ERROR(false);
        ++vertex_count;
      }
      ++edge_count;
    }
    ++face_count;
  }
  if (face_count < 1 || edge_count < 3 || vertex_count < 3)
    return false;
  if (face_count >= level0.m_face_count)
    return GlobalSubdivide();

  // Get face subdivision points
  ON_SimpleArray<ON_SubDFace*> faces(face_count);
  ON_SimpleArray<ON_3dPoint> face_points(face_count);

  // this subd is being modified.
  ChangeGeometryContentSerialNumber( false);

  for (const ON_SubDFace* f0 = level0.m_face[0]; nullptr != f0; f0 = f0->m_next_face)
  {
    if (false == f0->m_status.RuntimeMark())
      continue;
    faces.Append(const_cast<ON_SubDFace*>(f0));
    P = f0->SubdivisionPoint();
    if ( false == P.IsValid())
      return ON_SUBD_RETURN_ERROR(false);
    face_points.Append(P);
  }
  if (face_count != face_points.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(false);

  // Get edge subdivision points
  ON_SimpleArray<ON_3dPoint> edge_points(edge_count);
  ON_SimpleArray<ON_SubDEdge*> edges(edge_count);
  for (const ON_SubDEdge* e0 = level0.m_edge[0]; nullptr != e0; e0 = e0->m_next_edge)
  {
    if (false == e0->m_status.RuntimeMark())
      continue;
    P = (e0->IsSmooth() && 2 == e0->m_face_count && 2 == e0->MarkedFaceCount()) ? e0->SubdivisionPoint() : e0->ControlNetCenterPoint();
    edge_points.Append(P);
    edges.Append(const_cast<ON_SubDEdge*>(e0));
  }
  if ( edge_count != edge_points.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(false);

  // Set vertex points
  for (const ON_SubDVertex* v0 = level0.m_vertex[0]; nullptr != v0; v0 = v0->m_next_vertex)
  {
    if (false == v0->m_status.RuntimeMark() || v0->m_edge_count < 2 || ((unsigned)v0->m_edge_count) != v0->MarkedEdgeCount())
      continue;
    P = v0->SubdivisionPoint();
    ON_SubDVertex* v = const_cast<ON_SubDVertex*>(v0);
    v->m_P[0] = P.x;
    v->m_P[1] = P.y;
    v->m_P[2] = P.z;
  }

  // split edges
  for (unsigned edex = 0; edex < edge_count; ++edex)
  {
    ON_SubDEdge* e = edges[edex];

    const ON_SubDEdgeSharpness e_sharpness = e->Sharpness(false);

    e->EdgeModifiedNofification();
    const ON_SubDEdge* new_edge = SplitEdge(e, edge_points[edex]);
    if (nullptr == new_edge)
      return ON_SUBD_RETURN_ERROR(false);
    new_edge->m_status.ClearRuntimeMark();
    e->m_status.SetRuntimeMark();

    // LOCAL subdivide is more of an add control points to an existing level
    // as opposed to a global subdivision level operation. It will be common
    // for the input to include some but not all sharp edges.
    // Dale Lear's best guess on Nov 9, 2022 is that
    // reusing the original sharpness is the best way to maximize overall
    // user happiness. This makes some sense because the level of the edges
    // is not changing in a LOCAL subdivide. 
    // It is a near certainty that some users will not like this in some cases. 
    const_cast<ON_SubDEdge*>(e)->SetSharpnessForExperts(ON_SubDEdgeSharpness::FromInterval(e_sharpness[0], e_sharpness.Average()));
    const_cast<ON_SubDEdge*>(new_edge)->SetSharpnessForExperts(ON_SubDEdgeSharpness::FromInterval(e_sharpness.Average(), e_sharpness[1]));
  }

  ON_SimpleArray<ON_SubDEdgePtr> fbdry(32);
  ON_SimpleArray<ON_SubDEdge*> radial_edges(32);
  for (unsigned fdex = 0; fdex < face_count; ++fdex)
  {
    ON_SubDFace* f = faces[fdex];
    f->FaceModifiedNofification();
    P = face_points[fdex];
    fbdry.SetCount(0);
    const unsigned e_count = f->GetEdgeArray(fbdry);
    if (e_count < 6 || 0 != e_count %2)
      return ON_SUBD_RETURN_ERROR(false);

    // Get edges[] with edge[0] = marked edges.
    const ON_SubDEdgePtr* eptrs = fbdry.Array();
    if (nullptr != eptrs[0].RelativeVertex(0) && false == eptrs[0].RelativeVertex(0)->Mark() )
    {
      fbdry.Append(eptrs[0]);
      eptrs = fbdry.Array() + 1;
    }

    // save face status and candidate_face
    unsigned int candidate_face_id = f->m_id;
    const ON_ComponentStatus fstatus = f->m_status;

    for (unsigned fei = 0; fei < e_count; ++fei)
    {
      ON_SubDEdge* e = eptrs[fei].Edge();
      if ( nullptr == e)
        return ON_SUBD_RETURN_ERROR(false);
      const ON_SubDVertex* ev[2] = { eptrs[fei].RelativeVertex(0), eptrs[fei].RelativeVertex(1) };
      if ( nullptr == ev[0] || nullptr == ev[1] || ev[0] == ev[1])
        return ON_SUBD_RETURN_ERROR(false);
      if (0 == fei % 2)
      {
        if (false == ev[0]->Mark())
          return ON_SUBD_RETURN_ERROR(false);
        if (ev[1]->Mark())
          return ON_SUBD_RETURN_ERROR(false);
      }
      else
      {
        if (ev[0]->Mark())
          return ON_SUBD_RETURN_ERROR(false);
        if (false == ev[1]->Mark())
          return ON_SUBD_RETURN_ERROR(false);
      }
    }

    // remove face that will be subdivided;
    for (unsigned short fei = 0; fei < f->m_edge_count; ++fei)
    {
      eptrs[fei].Edge()->RemoveFaceFromArray(f);
      const_cast<ON_SubDVertex*>(eptrs[fei].RelativeVertex(0))->RemoveFaceFromArray(f);
    }
    ReturnFace(f);
    
    ON_SubDVertex* center = AllocateVertex(ON_SubDVertexTag::Smooth, level0_index, &P.x);
    AddVertexToLevel(center);

    radial_edges.SetCount(0);
    radial_edges.Reserve(e_count /2);
    for (unsigned fei = 0; fei < e_count; fei += 2)
    {
      ON_SubDEdge* r = AddEdge(ON_SubDEdgeTag::Smooth, center, ON_SubDSectorType::UnsetSectorCoefficient, const_cast<ON_SubDVertex*>(eptrs[fei].RelativeVertex(1)), ON_SubDSectorType::UnsetSectorCoefficient);
      radial_edges.Append(r);
    }

    ON_SubDEdge* r[2] = { nullptr,radial_edges[e_count / 2 - 1] };
    for (unsigned fei = 0; fei < e_count; fei += 2)
    {
      r[0] = r[1];
      r[1] = radial_edges[fei / 2];
      const ON_SubDEdgePtr qbdry[4] = {
        ON_SubDEdgePtr::Create(r[0],0),
        eptrs[(fei + e_count - 1) % e_count],
        eptrs[fei],
        ON_SubDEdgePtr::Create(r[1],1) 
      };
      ON_SubDFace* q = AddFace(candidate_face_id, 4, qbdry);
      candidate_face_id = 0;
      q->m_status = fstatus;
    }

  }

  level0.ClearRuntimeMarks(true, true, false);
  level0.ClearBoundingBox();
  level0.ClearEvaluationCache();
  level0.ClearEdgeFlags();

  if (nullptr != m_active_level)
    m_active_level->UpdateAllTagsAndSectorCoefficients(true);
  
  return true; 
}